

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O1

ChangeInfo *
capnp::compiler::anon_unknown_0::fieldUpgradeList
          (ChangeInfo *__return_storage_ptr__,Builder decl,uint *nextOrdinal,bool scopeHasUnion)

{
  SegmentReader *pSVar1;
  CapTableReader *pCVar2;
  int iVar3;
  SegmentBuilder *pSVar4;
  char *pcVar5;
  uint uVar6;
  size_t __n;
  ulong uVar7;
  char *__src;
  Reader RVar8;
  Builder relativeName;
  Builder type;
  Builder elementType;
  Builder typeParams;
  PointerReader local_128;
  StructBuilder local_100;
  int local_d8;
  StructBuilder local_d0;
  StructBuilder local_a8;
  ArrayPtr<const_char> local_80;
  StructBuilder local_70;
  ListBuilder local_48;
  ArrayPtr<const_char> *params_1;
  
  if (*(short *)((long)decl._builder.data + 0xc) == 1) {
    __return_storage_ptr__->kind = NO_CHANGE;
    kj::heapString(&__return_storage_ptr__->description,0x42);
    pcVar5 = (char *)(__return_storage_ptr__->description).content.size_;
    if (pcVar5 != (char *)0x0) {
      pcVar5 = (__return_storage_ptr__->description).content.ptr;
    }
    __src = "Upgrade primitive list to struct list, but it had a default value.";
    __n = 0x42;
  }
  else {
    local_100.data = decl._builder.pointers + 5;
    local_100.segment = decl._builder.segment;
    local_100.capTable = decl._builder.capTable;
    _::PointerBuilder::getStruct
              (&local_a8,(PointerBuilder *)&local_100,(StructSize)0x20003,(word *)0x0);
    if (*local_a8.data != 9) {
      __return_storage_ptr__->kind = NO_CHANGE;
      kj::heapString(&__return_storage_ptr__->description,0x3c);
      pcVar5 = (char *)(__return_storage_ptr__->description).content.size_;
      if (pcVar5 != (char *)0x0) {
        pcVar5 = (__return_storage_ptr__->description).content.ptr;
      }
      builtin_strncpy(pcVar5,"Upgrade primitive list to struct list, but it wasn\'t a list.",0x3c);
      return __return_storage_ptr__;
    }
    local_100.data = local_a8.pointers + 1;
    local_100.segment = local_a8.segment;
    local_100.capTable = local_a8.capTable;
    _::PointerBuilder::getStructList
              (&local_48,(PointerBuilder *)&local_100,(StructSize)0x20001,(word *)0x0);
    _::ListBuilder::getStructElement(&local_100,&local_48,0);
    local_d0.data = (void *)((long)local_100.pointers + 8);
    local_d0.segment = local_100.segment;
    local_d0.capTable = local_100.capTable;
    _::PointerBuilder::getStruct
              (&local_70,(PointerBuilder *)&local_d0,(StructSize)0x20003,(word *)0x0);
    local_100.segment = local_70.segment;
    local_100.capTable = local_70.capTable;
    local_100.data = local_70.pointers;
    _::PointerBuilder::getStruct
              (&local_d0,(PointerBuilder *)&local_100,(StructSize)0x10001,(word *)0x0);
    _::StructBuilder::asReader(&local_d0);
    params_1 = (ArrayPtr<const_char> *)local_100.pointers;
    local_128.segment = &(local_100.segment)->super_SegmentReader;
    local_128.capTable = &(local_100.capTable)->super_CapTableReader;
    if (local_100.pointerCount == 0) {
      local_d8 = 0x7fffffff;
      params_1 = (ArrayPtr<const_char> *)0x0;
      local_128.segment = &((SegmentBuilder *)0x0)->super_SegmentReader;
      local_128.capTable = (CapTableReader *)0x0;
    }
    local_128.pointer = (WirePointer *)params_1;
    local_128.nestingLimit = local_d8;
    RVar8 = _::PointerReader::getBlob<capnp::Text>(&local_128,(void *)0x0,0);
    uVar7 = RVar8.super_StringPtr.content.size_;
    pSVar4 = RVar8.super_StringPtr.content.ptr;
    if (((uVar7 == 0xb) && (iVar3 = bcmp(pSVar4,"StructType",10), iVar3 == 0)) ||
       ((6 < uVar7 &&
        (uVar6 = *(ushort *)((long)pSVar4 + (uVar7 - 3)) ^ 0x7463 |
                 *(uint *)((long)pSVar4 + (uVar7 - 7)) ^ 0x75727453,
        params_1 = (ArrayPtr<const_char> *)(ulong)uVar6, uVar6 == 0)))) {
      __return_storage_ptr__->kind = NO_CHANGE;
      kj::heapString(&__return_storage_ptr__->description,0x48);
      pcVar5 = (char *)(__return_storage_ptr__->description).content.size_;
      if (pcVar5 != (char *)0x0) {
        pcVar5 = (__return_storage_ptr__->description).content.ptr;
      }
      __src = "Upgrade primitive list to struct list, but it was already a struct list.";
    }
    else {
      if ((uVar7 != 5) || (iVar3 = bcmp(pSVar4,"Bool",4), iVar3 != 0)) {
        local_100.capTable = (CapTableBuilder *)(uVar7 - 1);
        local_80.ptr = "Struct";
        local_80.size_ = 6;
        local_100.segment = pSVar4;
        kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                  ((String *)&local_128,(_ *)&local_100,&local_80,params_1);
        pSVar4 = (SegmentBuilder *)local_128.segment;
        if (local_128.capTable == (CapTableReader *)0x0) {
          pSVar4 = (SegmentBuilder *)0x1e3c21;
        }
        RVar8.super_StringPtr.content.size_ =
             (long)&(local_128.capTable)->_vptr_CapTableReader +
             (ulong)(local_128.capTable == (CapTableReader *)0x0);
        local_100.segment = local_d0.segment;
        local_100.capTable = local_d0.capTable;
        local_100.data = local_d0.pointers;
        RVar8.super_StringPtr.content.ptr = (char *)pSVar4;
        _::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_100,RVar8);
        pCVar2 = local_128.capTable;
        pSVar1 = local_128.segment;
        if ((SegmentBuilder *)local_128.segment != (SegmentBuilder *)0x0) {
          local_128.segment = (SegmentReader *)0x0;
          local_128.capTable = (CapTableReader *)0x0;
          (**(code **)*(char **)&(local_128.pointer)->offsetAndKind)
                    (local_128.pointer,pSVar1,1,pCVar2,pCVar2,0);
        }
        __return_storage_ptr__->kind = COMPATIBLE;
        kj::heapString(&__return_storage_ptr__->description,0x25);
        pcVar5 = (char *)(__return_storage_ptr__->description).content.size_;
        if (pcVar5 != (char *)0x0) {
          pcVar5 = (__return_storage_ptr__->description).content.ptr;
        }
        builtin_strncpy(pcVar5,"Upgrade primitive list to struct list",0x25);
        return __return_storage_ptr__;
      }
      __return_storage_ptr__->kind = NO_CHANGE;
      kj::heapString(&__return_storage_ptr__->description,0x48);
      pcVar5 = (char *)(__return_storage_ptr__->description).content.size_;
      if (pcVar5 != (char *)0x0) {
        pcVar5 = (__return_storage_ptr__->description).content.ptr;
      }
      __src = "Upgrade primitive list to struct list, but bool lists can\'t be upgraded.";
    }
    __n = 0x48;
  }
  memcpy(pcVar5,__src,__n);
  return __return_storage_ptr__;
}

Assistant:

static ChangeInfo fieldUpgradeList(Declaration::Builder decl, uint& nextOrdinal,
                                   bool scopeHasUnion) {
  // Upgrades a non-struct list to a struct list.

  auto field = decl.getField();
  if (field.getDefaultValue().isValue()) {
    return { NO_CHANGE, "Upgrade primitive list to struct list, but it had a default value." };
  }

  auto type = field.getType();
  if (!type.isApplication()) {
    return { NO_CHANGE, "Upgrade primitive list to struct list, but it wasn't a list." };
  }
  auto typeParams = type.getApplication().getParams();

  auto elementType = typeParams[0].getValue();
  auto relativeName = elementType.getRelativeName();
  auto nameText = relativeName.asReader().getValue();
  if (nameText == "StructType" || nameText.endsWith("Struct")) {
    return { NO_CHANGE, "Upgrade primitive list to struct list, but it was already a struct list."};
  }
  if (nameText == "Bool") {
    return { NO_CHANGE, "Upgrade primitive list to struct list, but bool lists can't be upgraded."};
  }

  relativeName.setValue(kj::str(nameText, "Struct"));
  return { COMPATIBLE, "Upgrade primitive list to struct list" };
}